

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportFragments.c
# Opt level: O0

sbfBuffer sbfTport_assemble(sbfTportStream tstream,sbfTportTopic ttopic,sbfTportHeader hdr)

{
  undefined8 uVar1;
  sbfBufferDestroyCb in_RDX;
  size_t in_RSI;
  void *in_RDI;
  sbfBuffer returned;
  void *in_stack_ffffffffffffffd8;
  sbfBuffer local_8;
  
  if ((uint)(byte)in_RDX[2] == *(int *)(in_RSI + 0x30) + 1U) {
    if (*(long *)(in_RSI + 0x40) == 0) {
      if (in_RDX[2] != (_func_void_sbfBuffer_void_ptr_void_ptr)0x1) goto LAB_0010ae08;
      *(undefined8 *)(in_RSI + 0x48) = 0x2000;
      uVar1 = sbfMemory_malloc(*(undefined8 *)(in_RSI + 0x48));
      *(undefined8 *)(in_RSI + 0x40) = uVar1;
      *(undefined4 *)(in_RSI + 0x30) = 1;
      *(undefined8 *)(in_RSI + 0x38) = 0;
    }
    else {
      *(uint *)(in_RSI + 0x30) = (uint)(byte)in_RDX[2];
    }
    while (*(ulong *)(in_RSI + 0x48) < *(long *)(in_RSI + 0x38) + (ulong)*(ushort *)in_RDX) {
      uVar1 = sbfMemory_realloc(*(undefined8 *)(in_RSI + 0x40),2,*(undefined8 *)(in_RSI + 0x48));
      *(undefined8 *)(in_RSI + 0x40) = uVar1;
      *(long *)(in_RSI + 0x48) = *(long *)(in_RSI + 0x48) << 1;
    }
    memcpy((void *)(*(long *)(in_RSI + 0x40) + *(long *)(in_RSI + 0x38)),
           in_RDX + (long)(int)(uint)(byte)in_RDX[3] + 5,(ulong)*(ushort *)in_RDX);
    *(ulong *)(in_RSI + 0x38) = (ulong)*(ushort *)in_RDX + *(long *)(in_RSI + 0x38);
    if (((byte)in_RDX[4] & 2) == 0) {
      local_8 = (sbfBuffer)0x0;
    }
    else {
      local_8 = sbfBuffer_wrap(in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      *(undefined8 *)(in_RSI + 0x40) = 0;
      *(undefined4 *)(in_RSI + 0x30) = 0;
    }
  }
  else {
LAB_0010ae08:
    if (*(long *)(in_RSI + 0x40) != 0) {
      free(*(void **)(in_RSI + 0x40));
    }
    *(undefined8 *)(in_RSI + 0x40) = 0;
    *(undefined4 *)(in_RSI + 0x30) = 0;
    local_8 = (sbfBuffer)0x0;
  }
  return local_8;
}

Assistant:

sbfBuffer
sbfTport_assemble (sbfTportStream tstream,
                   sbfTportTopic ttopic,
                   sbfTportHeader hdr)
{
    sbfBuffer returned;

    if (hdr->mFragNum != ttopic->mFragNum + 1)
        goto invalid;

    if (ttopic->mFragData == NULL)
    {
        if (hdr->mFragNum != 1)
            goto invalid;

        ttopic->mFragAllocated = 8192;
        ttopic->mFragData = xmalloc (ttopic->mFragAllocated);

        ttopic->mFragNum = 1;
        ttopic->mFragSize = 0;
    }
    else
        ttopic->mFragNum = hdr->mFragNum;

    while (ttopic->mFragAllocated < ttopic->mFragSize + hdr->mSize)
    {
        ttopic->mFragData = xrealloc (ttopic->mFragData,
                                      2,
                                      ttopic->mFragAllocated);
        ttopic->mFragAllocated *= 2;
    }

    memcpy ((char*)ttopic->mFragData + ttopic->mFragSize,
            (char*)(hdr + 1) + hdr->mTopicSize,
            hdr->mSize);
    ttopic->mFragSize += hdr->mSize;

    if (!(hdr->mFlags & SBF_MESSAGE_FLAG_LAST_FRAGMENT))
        return NULL;
    returned = sbfBuffer_wrap (ttopic->mFragData,
                               ttopic->mFragSize,
                               sbfTportFragmentBufferDestroyCb,
                               NULL);

    ttopic->mFragData = NULL;
    ttopic->mFragNum = 0;
    return returned;

invalid:
    if (ttopic->mFragData != NULL)
        free (ttopic->mFragData);

    ttopic->mFragData = NULL;
    ttopic->mFragNum = 0;
    return NULL;
}